

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_roundingutils.h
# Opt level: O2

bool icu_63::number::impl::roundingutils::getRoundingDirection
               (bool isEven,bool isNegative,Section section,RoundingMode roundingMode,
               UErrorCode *status)

{
  byte bVar1;
  byte bVar2;
  
  switch(roundingMode) {
  case UNUM_ROUND_CEILING:
    goto switchD_00213551_caseD_0;
  case UNUM_ROUND_FLOOR:
    isNegative = !isNegative;
    goto switchD_00213551_caseD_0;
  case UNUM_ROUND_DOWN:
    goto switchD_00213551_caseD_2;
  case UNUM_ROUND_UP:
    goto switchD_00213551_caseD_3;
  case UNUM_FOUND_HALFEVEN:
    if (section == SECTION_UPPER) goto switchD_00213551_caseD_3;
    isNegative = isEven;
    if (section == SECTION_MIDPOINT) goto switchD_00213551_caseD_0;
    if (section != SECTION_LOWER) break;
    goto switchD_00213551_caseD_2;
  case UNUM_ROUND_HALFDOWN:
    if ((uint)(section + SECTION_LOWER_EDGE) < 3) {
      bVar2 = (byte)(section + SECTION_LOWER_EDGE);
      bVar1 = 3;
LAB_00213584:
      isNegative = (bool)(bVar1 >> (bVar2 & 7));
      goto switchD_00213551_caseD_0;
    }
    break;
  case UNUM_ROUND_HALFUP:
    if ((uint)(section + SECTION_LOWER_EDGE) < 3) {
      bVar2 = (byte)(section + SECTION_LOWER_EDGE);
      bVar1 = 1;
      goto LAB_00213584;
    }
  }
  *status = U_FORMAT_INEXACT_ERROR;
switchD_00213551_caseD_3:
  isNegative = false;
switchD_00213551_caseD_0:
  return (bool)(isNegative & 1);
switchD_00213551_caseD_2:
  isNegative = true;
  goto switchD_00213551_caseD_0;
}

Assistant:

inline bool
getRoundingDirection(bool isEven, bool isNegative, Section section, RoundingMode roundingMode,
                     UErrorCode &status) {
    switch (roundingMode) {
        case RoundingMode::UNUM_ROUND_UP:
            // round away from zero
            return false;

        case RoundingMode::UNUM_ROUND_DOWN:
            // round toward zero
            return true;

        case RoundingMode::UNUM_ROUND_CEILING:
            // round toward positive infinity
            return isNegative;

        case RoundingMode::UNUM_ROUND_FLOOR:
            // round toward negative infinity
            return !isNegative;

        case RoundingMode::UNUM_ROUND_HALFUP:
            switch (section) {
                case SECTION_MIDPOINT:
                    return false;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        case RoundingMode::UNUM_ROUND_HALFDOWN:
            switch (section) {
                case SECTION_MIDPOINT:
                    return true;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        case RoundingMode::UNUM_ROUND_HALFEVEN:
            switch (section) {
                case SECTION_MIDPOINT:
                    return isEven;
                case SECTION_LOWER:
                    return true;
                case SECTION_UPPER:
                    return false;
                default:
                    break;
            }
            break;

        default:
            break;
    }

    status = U_FORMAT_INEXACT_ERROR;
    return false;
}